

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.cpp
# Opt level: O1

int main(int argc,char **argv)

{
  ulong in_RAX;
  char ch;
  undefined8 uStack_28;
  
  uStack_28 = in_RAX & 0xffffffffffffff;
  do {
    InitVariables();
    GetInput();
    CalcInfo();
    CreateCache();
    FileTest();
    PrintOutput();
    std::__ostream_insert<char,std::char_traits<char>>
              ((ostream *)&std::cout,"Continue/Exit(C/E)",0x12);
    std::ios::widen((char)*(undefined8 *)(std::cout + -0x18) + -0x80);
    std::ostream::put(-0x80);
    std::ostream::flush();
    std::operator>>((istream *)&std::cin,(char *)((long)&uStack_28 + 7));
  } while ((uStack_28._7_1_ & 0xdf) != 0x45);
  return 0;
}

Assistant:

int main(int argc, char* argv[])
{
	char ch = '\0';

	do
	{
		InitVariables();
		GetInput();
		CalcInfo();
		CreateCache();
		FileTest();
		PrintOutput();
		std::cout << "Continue/Exit(C/E)" << std::endl;
		std::cin >> ch;
	} while ((ch != 'e') && (ch != 'E'));

	return 0;
}